

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PublicationInfo.cpp
# Opt level: O3

void __thiscall
helics::PublicationInfo::disconnectFederate(PublicationInfo *this,GlobalFederateId fedToDisconnect)

{
  pointer pSVar1;
  pointer pSVar2;
  pointer pSVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  iterator __first;
  
  pSVar2 = (this->subscribers).
           super__Vector_base<helics::SubscriberInformation,_std::allocator<helics::SubscriberInformation>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pSVar1 = (this->subscribers).
           super__Vector_base<helics::SubscriberInformation,_std::allocator<helics::SubscriberInformation>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  lVar4 = (long)pSVar1 - (long)pSVar2;
  lVar5 = (lVar4 >> 3) * -0x3333333333333333 >> 2;
  pSVar3 = pSVar2;
  lVar6 = lVar4;
  if (0 < lVar5) {
    pSVar3 = pSVar2 + lVar5 * 4;
    lVar5 = lVar5 + 1;
    __first._M_current = pSVar2 + 2;
    do {
      if (__first._M_current[-2].id.fed_id.gid == fedToDisconnect.gid) {
        __first._M_current = __first._M_current + -2;
        goto LAB_00315176;
      }
      if (__first._M_current[-1].id.fed_id.gid == fedToDisconnect.gid) {
        __first._M_current = __first._M_current + -1;
        goto LAB_00315176;
      }
      if (((__first._M_current)->id).fed_id.gid == fedToDisconnect.gid) goto LAB_00315176;
      if (__first._M_current[1].id.fed_id.gid == fedToDisconnect.gid) {
        __first._M_current = __first._M_current + 1;
        goto LAB_00315176;
      }
      lVar5 = lVar5 + -1;
      __first._M_current = __first._M_current + 4;
    } while (1 < lVar5);
    lVar6 = (long)pSVar1 - (long)pSVar3;
  }
  lVar6 = (lVar6 >> 3) * -0x3333333333333333;
  if (lVar6 == 1) {
LAB_0031515b:
    __first._M_current = pSVar3;
    if ((pSVar3->id).fed_id.gid != fedToDisconnect.gid) {
      __first._M_current = pSVar1;
    }
  }
  else if (lVar6 == 2) {
LAB_00315153:
    __first._M_current = pSVar3;
    if ((pSVar3->id).fed_id.gid != fedToDisconnect.gid) {
      pSVar3 = pSVar3 + 1;
      goto LAB_0031515b;
    }
  }
  else {
    __first._M_current = pSVar1;
    if (lVar6 != 3) goto LAB_003151c8;
    __first._M_current = pSVar3;
    if ((pSVar3->id).fed_id.gid != fedToDisconnect.gid) {
      pSVar3 = pSVar3 + 1;
      goto LAB_00315153;
    }
  }
LAB_00315176:
  pSVar3 = __first._M_current + 1;
  if (pSVar3 != pSVar1 && __first._M_current != pSVar1) {
    do {
      if ((pSVar3->id).fed_id.gid != fedToDisconnect.gid) {
        (__first._M_current)->id = pSVar3->id;
        CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
        operator=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  &(__first._M_current)->key,
                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&pSVar3->key)
        ;
        __first._M_current = __first._M_current + 1;
      }
      pSVar3 = pSVar3 + 1;
    } while (pSVar3 != pSVar1);
    pSVar2 = (this->subscribers).
             super__Vector_base<helics::SubscriberInformation,_std::allocator<helics::SubscriberInformation>_>
             ._M_impl.super__Vector_impl_data._M_start;
    lVar4 = (long)(this->subscribers).
                  super__Vector_base<helics::SubscriberInformation,_std::allocator<helics::SubscriberInformation>_>
                  ._M_impl.super__Vector_impl_data._M_finish - (long)pSVar2;
  }
LAB_003151c8:
  std::vector<helics::SubscriberInformation,_std::allocator<helics::SubscriberInformation>_>::
  _M_erase(&this->subscribers,__first,
           (SubscriberInformation *)((long)&(pSVar2->id).fed_id.gid + lVar4));
  return;
}

Assistant:

void PublicationInfo::disconnectFederate(GlobalFederateId fedToDisconnect)
{
    subscribers.erase(std::remove_if(subscribers.begin(),
                                     subscribers.end(),
                                     [fedToDisconnect](const auto& val) {
                                         return val.id.fed_id == fedToDisconnect;
                                     }),
                      subscribers.end());
}